

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O3

void slang::iterDirectory
               (path *path,SmallVector<std::filesystem::__cxx11::path,_2UL> *results,GlobMode mode)

{
  file_type fVar1;
  directory_entry *pdVar2;
  path *args;
  directory_iterator it;
  error_code ec;
  error_code eStack_68;
  error_code local_58;
  path local_48;
  
  local_58._M_value = 0;
  local_58._M_cat = (error_category *)std::_V2::system_category();
  if ((path->_M_pathname)._M_string_length == 0) {
    std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
              (&local_48,(char (*) [2])0x53bbfa,auto_format);
  }
  else {
    std::filesystem::__cxx11::path::path(&local_48,path);
  }
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&eStack_68,&local_48,
             skip_permission_denied|follow_directory_symlink,&local_58);
  std::filesystem::__cxx11::path::~path(&local_48);
  do {
    if (eStack_68._M_cat == (error_category *)0x0) {
      return;
    }
    if (mode == Directories) {
      pdVar2 = (directory_entry *)
               std::filesystem::__cxx11::directory_iterator::operator*
                         ((directory_iterator *)&eStack_68);
      fVar1 = std::filesystem::__cxx11::directory_entry::_M_file_type(pdVar2,&local_58);
      if (fVar1 == directory) {
LAB_0030f217:
        args = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                                 ((directory_iterator *)&eStack_68);
        SmallVectorBase<std::filesystem::__cxx11::path>::
        emplace_back<std::filesystem::__cxx11::path_const&>
                  (&results->super_SmallVectorBase<std::filesystem::__cxx11::path>,args);
      }
    }
    else if (mode == Files) {
      pdVar2 = (directory_entry *)
               std::filesystem::__cxx11::directory_iterator::operator*
                         ((directory_iterator *)&eStack_68);
      fVar1 = std::filesystem::__cxx11::directory_entry::_M_file_type(pdVar2,&local_58);
      if (fVar1 == regular) goto LAB_0030f217;
    }
    std::filesystem::__cxx11::directory_iterator::increment(&eStack_68);
  } while( true );
}

Assistant:

static void iterDirectory(const fs::path& path, SmallVector<fs::path>& results, GlobMode mode) {
    std::error_code ec;
    for (auto it = fs::directory_iterator(path.empty() ? "." : path,
                                          fs::directory_options::follow_directory_symlink |
                                              fs::directory_options::skip_permission_denied,
                                          ec);
         it != fs::directory_iterator(); it.increment(ec)) {
        if ((mode == GlobMode::Files && it->is_regular_file(ec)) ||
            (mode == GlobMode::Directories && it->is_directory(ec))) {
            results.emplace_back(it->path());
        }
    }
}